

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::bitcast_from_builtin_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRVariable *pSVar3;
  BaseType expr_type_00;
  string sStack_48;
  
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (pSVar3 != (SPIRVariable *)0x0) {
    source_id = (pSVar3->super_IVariant).self.id;
  }
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  if (!bVar1) {
    return;
  }
  uVar2 = Compiler::get_decoration(&this->super_Compiler,(ID)source_id,DecorationBuiltIn);
  expr_type_00 = Int;
  if (uVar2 < 0x2c) {
    if ((0xc00000406e0U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00231efb;
    if ((0x3f000000UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00231ecd;
  }
  else {
LAB_00231ecd:
    if (uVar2 - 0x1148 < 3) goto LAB_00231efb;
    if (1 < uVar2 - 0x14c7) {
      if ((uVar2 == 0x1396) || (uVar2 == 0x14cf)) goto LAB_00231efb;
      if (uVar2 != 0x14e7) {
        return;
      }
    }
  }
  expr_type_00 = UInt;
LAB_00231efb:
  if (expr_type_00 != *(BaseType *)&(expr_type->super_IVariant).field_0xc) {
    bitcast_expression(&sStack_48,this,expr_type,expr_type_00,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&sStack_48);
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void CompilerGLSL::bitcast_from_builtin_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(source_id);
	if (var)
		source_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(source_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInSampleId:
	case BuiltInBaseVertex:
	case BuiltInBaseInstance:
	case BuiltInDrawIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInInstanceCustomIndexNV:
		expected_type = SPIRType::Int;
		break;

	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInIncomingRayFlagsNV:
	case BuiltInLaunchIdNV:
	case BuiltInLaunchSizeNV:
		expected_type = SPIRType::UInt;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
		expr = bitcast_expression(expr_type, expected_type, expr);
}